

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenBoundingBoxesProcess.cpp
# Opt level: O2

void __thiscall
Assimp::GenBoundingBoxesProcess::Execute(GenBoundingBoxesProcess *this,aiScene *pScene)

{
  aiMesh *mesh;
  uint i;
  ulong uVar1;
  aiVector3D local_48;
  aiVector3D local_38;
  
  if (pScene != (aiScene *)0x0) {
    for (uVar1 = 0; uVar1 < pScene->mNumMeshes; uVar1 = uVar1 + 1) {
      mesh = pScene->mMeshes[uVar1];
      if (mesh != (aiMesh *)0x0) {
        local_38.x = 999999.0;
        local_38.y = 999999.0;
        local_38.z = 999999.0;
        local_48.x = -999999.0;
        local_48.y = -999999.0;
        local_48.z = -999999.0;
        checkMesh(mesh,&local_38,&local_48);
        (mesh->mAABB).mMin.z = local_38.z;
        (mesh->mAABB).mMin.x = local_38.x;
        (mesh->mAABB).mMin.y = local_38.y;
        (mesh->mAABB).mMax.x = local_48.x;
        (mesh->mAABB).mMax.y = local_48.y;
        (mesh->mAABB).mMax.z = local_48.z;
      }
    }
  }
  return;
}

Assistant:

void GenBoundingBoxesProcess::Execute(aiScene* pScene) {
    if (nullptr == pScene) {
        return;
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        aiMesh* mesh = pScene->mMeshes[i];
        if (nullptr == mesh) {
            continue;
        }

        aiVector3D min(999999, 999999, 999999), max(-999999, -999999, -999999);
        checkMesh(mesh, min, max);
        mesh->mAABB.mMin = min;
        mesh->mAABB.mMax = max;
    }
}